

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  binary_stream_sink *this_00;
  size_t *psVar1;
  pointer psVar2;
  long lVar3;
  float fVar4;
  uint8_t buf_1 [4];
  uint8_t buf [8];
  uint local_24;
  ulong local_20;
  
  fVar4 = (float)val;
  this_00 = &this->sink_;
  if (((double)fVar4 != val) || (NAN((double)fVar4) || NAN(val))) {
    binary_stream_sink::push_back(this_00,0xcb);
    local_20 = (ulong)val >> 0x38 | ((ulong)val & 0xff000000000000) >> 0x28 |
               ((ulong)val & 0xff0000000000) >> 0x18 | ((ulong)val & 0xff00000000) >> 8 |
               ((ulong)val & 0xff000000) << 8 | ((ulong)val & 0xff0000) << 0x18 |
               ((ulong)val & 0xff00) << 0x28 | (long)val << 0x38;
    lVar3 = 0;
    do {
      binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_20 + lVar3));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  else {
    binary_stream_sink::push_back(this_00,0xca);
    local_24 = (uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 | ((uint)fVar4 & 0xff00) << 8 |
               (int)fVar4 << 0x18;
    lVar3 = 0;
    do {
      binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_24 + lVar3));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
            semantic_tag,
            const ser_context&,
            std::error_code&) final
        {
            float valf = (float)val;
            if ((double)valf == val)
            {
                // float 32
                sink_.push_back(jsoncons::msgpack::msgpack_type::float32_type);
                binary::native_to_big(valf,std::back_inserter(sink_));
            }
            else
            {
                // float 64
                sink_.push_back(jsoncons::msgpack::msgpack_type::float64_type);
                binary::native_to_big(val,std::back_inserter(sink_));
            }

            // write double

            end_value();
            JSONCONS_VISITOR_RETURN;
        }